

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmetrics.cpp
# Opt level: O0

void writeScanLine(OutputPart *out,FrameBuffer *buf,vector<double,_std::allocator<double>_> *perf)

{
  time_point end_00;
  vector<double,_std::allocator<double>_> *this;
  value_type_conflict1 *in_RDX;
  FrameBuffer *in_RDI;
  time_point end;
  time_point start;
  Box2i dw;
  Box<Imath_3_2::Vec2<int>_> *in_stack_ffffffffffffffa8;
  Box<Imath_3_2::Vec2<int>_> *in_stack_ffffffffffffffb0;
  time_point in_stack_ffffffffffffffc0;
  
  Imf_3_4::OutputPart::header();
  Imf_3_4::Header::dataWindow();
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  Imf_3_4::OutputPart::setFrameBuffer(in_RDI);
  end_00.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  Imf_3_4::OutputPart::writePixels((int)in_RDI);
  if (in_RDX != (value_type_conflict1 *)0x0) {
    this = (vector<double,_std::allocator<double>_> *)std::chrono::_V2::steady_clock::now();
    timing(in_stack_ffffffffffffffc0,end_00);
    std::vector<double,_std::allocator<double>_>::push_back(this,in_RDX);
  }
  return;
}

Assistant:

void
writeScanLine (OutputPart& out, FrameBuffer& buf, vector<double>* perf)
{
    Box2i dw = out.header ().dataWindow ();
    out.setFrameBuffer (buf);
    steady_clock::time_point start = steady_clock::now ();
    out.writePixels (dw.max.y - dw.min.y + 1);
    if (perf)
    {
        steady_clock::time_point end = steady_clock::now ();
        perf->push_back (timing (start, end));
    }
}